

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

string * __thiscall
iqnet::ssl::ConnectionVerifier::cert_finger_sha256_abi_cxx11_
          (string *__return_storage_ptr__,ConnectionVerifier *this,X509_STORE_CTX *ctx)

{
  X509 *data;
  EVP_MD *type;
  void *this_00;
  int local_1f4;
  ostringstream local_1f0 [4];
  int i;
  ostringstream ss;
  byte local_78 [8];
  uchar md [64];
  uint n;
  EVP_MD *digest;
  X509 *x;
  X509_STORE_CTX *ctx_local;
  ConnectionVerifier *this_local;
  
  data = X509_STORE_CTX_get_current_cert((X509_STORE_CTX *)ctx);
  type = EVP_get_digestbyname("sha256");
  md[0x3c] = '\0';
  md[0x3d] = '\0';
  md[0x3e] = '\0';
  md[0x3f] = '\0';
  X509_digest(data,type,local_78,(uint *)(md + 0x3c));
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  for (local_1f4 = 0; local_1f4 < 0x20; local_1f4 = local_1f4 + 1) {
    this_00 = (void *)std::ostream::operator<<(local_1f0,std::hex);
    std::ostream::operator<<(this_00,(uint)local_78[local_1f4]);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1f0);
  return __return_storage_ptr__;
}

Assistant:

std::string
ConnectionVerifier::cert_finger_sha256(X509_STORE_CTX* ctx) const
{
  X509* x = X509_STORE_CTX_get_current_cert(ctx);
  const EVP_MD* digest = EVP_get_digestbyname("sha256");
  unsigned int n = 0;
  unsigned char md[EVP_MAX_MD_SIZE];
  X509_digest(x, digest, md, &n);

  std::ostringstream ss;
  for(int i = 0; i < 32; i++)
     ss << std::hex << int(md[i]);

  return ss.str();
}